

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::TruncateLogFile(char *path,int64 limit,int64 keep)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  ostream *poVar5;
  ssize_t sVar6;
  LogStream *pLVar7;
  SendMethod in_R9;
  uint uVar8;
  char *__s;
  uint uVar9;
  __off_t _Var10;
  stat statbuf;
  char copybuf [8192];
  LogMessage local_2100;
  code *local_20f0;
  undefined8 uStack_20e8;
  __off_t local_20e0;
  char *local_20d8;
  __off_t local_20d0;
  stat local_20c8;
  undefined1 local_2038 [8200];
  
  iVar1 = strncmp("/proc/self/fd/",path,0xe);
  iVar1 = open(path,(uint)(iVar1 != 0) << 0x11 | 2);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 == 0x1b) {
      iVar1 = truncate(path,0);
      if (iVar1 != -1) {
        LogMessage::LogMessage
                  (&local_2100,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x7c5,2);
        pLVar7 = &(local_2100.data_)->stream_;
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,"Truncated ",10);
        if (path == (char *)0x0) {
          std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar3 = strlen(path);
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,path,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pLVar7->super_ostream," due to EFBIG error",0x13);
        LogMessage::~LogMessage(&local_2100);
        return;
      }
      local_20f0 = LogMessage::SendToLog;
      uStack_20e8 = 0;
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_2100,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7c3,2,0,in_R9);
      pLVar7 = &(local_2100.data_)->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar7->super_ostream,"Unable to truncate ",0x13);
      if (path == (char *)0x0) {
        std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
      }
      else {
        sVar3 = strlen(path);
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,path,sVar3);
      }
    }
    else {
      local_20f0 = LogMessage::SendToLog;
      uStack_20e8 = 0;
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_2100,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7c8,2,0,in_R9);
      pLVar7 = &(local_2100.data_)->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar7->super_ostream,"Unable to open ",0xf);
      if (path == (char *)0x0) {
        std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
      }
      else {
        sVar3 = strlen(path);
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,path,sVar3);
      }
    }
    ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2100);
    return;
  }
  iVar2 = fstat(iVar1,&local_20c8);
  if (iVar2 == -1) {
    local_20f0 = LogMessage::SendToLog;
    uStack_20e8 = 0;
    ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x7ce,2,0,in_R9);
    std::__ostream_insert<char,std::char_traits<char>>
              (&((local_2100.data_)->stream_).super_ostream,"Unable to fstat()",0x11);
  }
  else {
    if (((local_20c8.st_mode & 0xf000) != 0x8000) ||
       ((local_20c8.st_size - keep == 0 || local_20c8.st_size < keep) || local_20c8.st_size <= limit
       )) goto LAB_001140f3;
    local_20e0 = local_20c8.st_size - keep;
    LogMessage::LogMessage
              (&local_2100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x7d9);
    _Var10 = local_20e0;
    pLVar7 = &(local_2100.data_)->stream_;
    std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,"Truncating ",0xb);
    if (path == (char *)0x0) {
      std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(path);
      std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,path,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream," to ",4);
    poVar5 = std::ostream::_M_insert<long>((long)pLVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes",6);
    LogMessage::~LogMessage(&local_2100);
    sVar6 = pread(iVar1,local_2038,0x2000,_Var10);
    iVar2 = (int)sVar6;
    local_20d8 = path;
    if (iVar2 < 1) {
      _Var10 = 0;
    }
    else {
      _Var10 = 0;
      do {
        uVar9 = (uint)sVar6;
        sVar6 = pwrite(iVar1,local_2038,(ulong)(uVar9 & 0x7fffffff),_Var10);
        uVar8 = (uint)sVar6;
        if (uVar8 == 0xffffffff) {
          local_20f0 = LogMessage::SendToLog;
          uStack_20e8 = 0;
          ErrnoLogMessage::ErrnoLogMessage
                    ((ErrnoLogMessage *)&local_2100,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                     ,0x7e2,2,0,in_R9);
          pLVar7 = &(local_2100.data_)->stream_;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pLVar7->super_ostream,"Unable to write to ",0x13);
          __s = local_20d8;
          if (local_20d8 == (char *)0x0) {
            std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
          }
          else {
            sVar3 = strlen(local_20d8);
            std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,__s,sVar3);
          }
          goto LAB_00114537;
        }
        if (uVar9 != uVar8) {
          local_20d0 = _Var10;
          LogMessage::LogMessage
                    (&local_2100,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                     ,0x7e5,2);
          pLVar7 = &(local_2100.data_)->stream_;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pLVar7->super_ostream,"Expected to write ",0x12);
          poVar5 = (ostream *)std::ostream::operator<<(pLVar7,uVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", wrote ",8);
          std::ostream::operator<<(poVar5,uVar8);
          LogMessage::~LogMessage(&local_2100);
          _Var10 = local_20d0;
        }
        local_20e0 = local_20e0 + (ulong)(uVar9 & 0x7fffffff);
        _Var10 = _Var10 + (int)uVar8;
        sVar6 = pread(iVar1,local_2038,0x2000,local_20e0);
        iVar2 = (int)sVar6;
      } while (0 < iVar2);
    }
    __s = local_20d8;
    if (iVar2 == -1) {
      local_20f0 = LogMessage::SendToLog;
      uStack_20e8 = 0;
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_2100,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x7ea,2,0,in_R9);
      pLVar7 = &(local_2100.data_)->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar7->super_ostream,"Unable to read from ",0x14);
      if (__s == (char *)0x0) {
        std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,__s,sVar3);
      }
LAB_00114537:
      ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2100);
    }
    iVar2 = ftruncate(iVar1,_Var10);
    if (iVar2 != -1) goto LAB_001140f3;
    local_20f0 = LogMessage::SendToLog;
    uStack_20e8 = 0;
    ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_2100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x7f0,2,0,in_R9);
    pLVar7 = &(local_2100.data_)->stream_;
    std::__ostream_insert<char,std::char_traits<char>>
              (&pLVar7->super_ostream,"Unable to truncate ",0x13);
    if (__s == (char *)0x0) {
      std::ios::clear((int)pLVar7 + (int)(pLVar7->super_ostream)._vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(&pLVar7->super_ostream,__s,sVar3);
    }
  }
  ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_2100);
LAB_001140f3:
  close(iVar1);
  return;
}

Assistant:

void TruncateLogFile(const char *path, int64 limit, int64 keep) {
#ifdef HAVE_UNISTD_H
  struct stat statbuf;
  const int kCopyBlockSize = 8 << 10;
  char copybuf[kCopyBlockSize];
  int64 read_offset, write_offset;
  // Don't follow symlinks unless they're our own fd symlinks in /proc
  int flags = O_RDWR;
  // TODO(hamaji): Support other environments.
#ifdef OS_LINUX
  const char *procfd_prefix = "/proc/self/fd/";
  if (strncmp(procfd_prefix, path, strlen(procfd_prefix))) flags |= O_NOFOLLOW;
#endif

  int fd = open(path, flags);
  if (fd == -1) {
    if (errno == EFBIG) {
      // The log file in question has got too big for us to open. The
      // real fix for this would be to compile logging.cc (or probably
      // all of base/...) with -D_FILE_OFFSET_BITS=64 but that's
      // rather scary.
      // Instead just truncate the file to something we can manage
      if (truncate(path, 0) == -1) {
        PLOG(ERROR) << "Unable to truncate " << path;
      } else {
        LOG(ERROR) << "Truncated " << path << " due to EFBIG error";
      }
    } else {
      PLOG(ERROR) << "Unable to open " << path;
    }
    return;
  }

  if (fstat(fd, &statbuf) == -1) {
    PLOG(ERROR) << "Unable to fstat()";
    goto out_close_fd;
  }

  // See if the path refers to a regular file bigger than the
  // specified limit
  if (!S_ISREG(statbuf.st_mode)) goto out_close_fd;
  if (statbuf.st_size <= limit)  goto out_close_fd;
  if (statbuf.st_size <= keep) goto out_close_fd;

  // This log file is too large - we need to truncate it
  LOG(INFO) << "Truncating " << path << " to " << keep << " bytes";

  // Copy the last "keep" bytes of the file to the beginning of the file
  read_offset = statbuf.st_size - keep;
  write_offset = 0;
  int bytesin, bytesout;
  while ((bytesin = pread(fd, copybuf, sizeof(copybuf), read_offset)) > 0) {
    bytesout = pwrite(fd, copybuf, bytesin, write_offset);
    if (bytesout == -1) {
      PLOG(ERROR) << "Unable to write to " << path;
      break;
    } else if (bytesout != bytesin) {
      LOG(ERROR) << "Expected to write " << bytesin << ", wrote " << bytesout;
    }
    read_offset += bytesin;
    write_offset += bytesout;
  }
  if (bytesin == -1) PLOG(ERROR) << "Unable to read from " << path;

  // Truncate the remainder of the file. If someone else writes to the
  // end of the file after our last read() above, we lose their latest
  // data. Too bad ...
  if (ftruncate(fd, write_offset) == -1) {
    PLOG(ERROR) << "Unable to truncate " << path;
  }

 out_close_fd:
  close(fd);
#else
  LOG(ERROR) << "No log truncation support.";
#endif
}